

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_node_check_utf8(mpack_node_t node)

{
  _Bool _Var1;
  mpack_tree_t *pmVar2;
  mpack_node_data_t *pmVar3;
  
  pmVar2 = node.tree;
  pmVar3 = node.data;
  if (pmVar2->error == mpack_ok) {
    if ((pmVar3->type == mpack_type_str) &&
       (_Var1 = mpack_utf8_check_impl
                          ((uint8_t *)(pmVar2->data + (long)(pmVar3->value).children),
                           (ulong)pmVar3->len,true), _Var1)) {
      return;
    }
    pmVar2->error = mpack_error_type;
    if (pmVar2->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar2->error_fn)(pmVar2,mpack_error_type);
      return;
    }
  }
  return;
}

Assistant:

void mpack_node_check_utf8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return;
    mpack_node_data_t* data = node.data;
    if (data->type != mpack_type_str || !mpack_utf8_check(mpack_node_data_unchecked(node), data->len))
        mpack_node_flag_error(node, mpack_error_type);
}